

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedDynamicPaths::Run(AdvancedDynamicPaths *this)

{
  CallLogWrapper *this_00;
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  bool bVar4;
  GLuint program;
  GLint GVar5;
  long lVar6;
  bool *compile_error;
  ulong uVar7;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  vec4 expected [4];
  float afStack_b4 [2];
  allocator_type local_a9;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  float afStack_70 [2];
  value_type local_68;
  float local_58 [12];
  
  local_a8 = (undefined1  [8])&local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,
             "\nlayout(local_size_x = 4) in;\nlayout(std140, binding = 0) buffer Output {\n  vec4 g_output[4];\n};\nuniform isamplerBuffer g_path_buffer;\nuniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));\nuniform samplerBuffer g_input1;\nlayout(binding = 1, std430) buffer Input2 {\n  vec4[4] g_input2;\n};\n\nvoid Path2(int id) {\n  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));\n}\nvoid main() {\n  const int id = int(gl_GlobalInvocationID.x);\n  const int path = texelFetch(g_path_buffer, id).x;\n\n  if (path == 0) {\n    g_output[id] = g_input0[gl_LocalInvocationID.x];\n    memoryBarrier();\n  } else if (path == 1) {\n    return;\n  } else if (path == 2) {\n    Path2(id);\n    return;\n  } else if (path == 3) {\n    g_output[id] = g_input2[path - 1];\n    memoryBarrierBuffer();\n  }\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram
                      (&this->super_ComputeShaderBase,(string *)local_a8);
  this->m_program = program;
  if (local_a8 != (undefined1  [8])&local_98) {
    operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar4 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar6 = -1;
  if (bVar4) {
    glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_buffer);
    glu::CallLogWrapper::glGenTextures(this_00,2,this->m_texture);
    local_68.m_data[0] = -100.0;
    local_68.m_data[1] = -100.0;
    local_68.m_data[2] = -100.0;
    local_68.m_data[3] = -100.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8,4,
               &local_68,&local_a9);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,(long)uStack_a0 - (long)local_a8,(void *)local_a8,0x88ea);
    if (local_a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity - (long)local_a8);
    }
    local_a8 = (undefined1  [8])0x3f8000003f800000;
    uStack_a0 = (pointer)0x3f8000003f800000;
    local_98._M_allocated_capacity = 0x4000000040000000;
    local_98._8_8_ = 0x4000000040000000;
    local_88 = 0x4040000040400000;
    uStack_80 = 0x4040000040400000;
    local_78 = 0x4080000040800000;
    afStack_70[0] = 4.0;
    afStack_70[1] = 4.0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,local_a8,0x88ea);
    local_a8 = (undefined1  [8])0x200000003;
    uStack_a0 = (pointer)&DAT_00000001;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer[2]);
    lVar6 = 0x10;
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x10,local_a8,0x88e4);
    uVar7 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8235,this->m_buffer[2]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    local_a8 = (undefined1  [8])0x4120000041200000;
    uStack_a0 = (pointer)0x4120000041200000;
    local_98._M_allocated_capacity = 0x41a0000041a00000;
    local_98._8_8_ = 0x41a0000041a00000;
    local_88 = 0x41f0000041f00000;
    uStack_80 = 0x41f0000041f00000;
    local_78 = 0x4220000042200000;
    afStack_70[0] = 40.0;
    afStack_70[1] = 40.0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x40,local_a8,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer[3]);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_path_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,0);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_input1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[0]);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_texture[1]);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    local_78 = 0;
    afStack_70[0] = 0.0;
    afStack_70[1] = 0.0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_allocated_capacity = 0;
    local_98._8_8_ = 0;
    local_a8 = (undefined1  [8])0x0;
    uStack_a0 = (pointer)0x0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer[0]);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x40,local_a8);
    local_68.m_data[0] = 3.0;
    local_68.m_data[1] = 3.0;
    local_68.m_data[2] = 3.0;
    local_68.m_data[3] = 3.0;
    local_58[0] = 20.0;
    local_58[1] = 20.0;
    local_58[2] = 20.0;
    local_58[3] = 20.0;
    local_58[4] = -100.0;
    local_58[5] = -100.0;
    local_58[6] = -100.0;
    local_58[7] = -100.0;
    local_58[8] = 400.0;
    local_58[9] = 400.0;
    local_58[10] = 400.0;
    local_58[0xb] = 400.0;
    if (((float)local_a8._0_4_ != 3.0) || (NAN((float)local_a8._0_4_))) {
      bVar4 = true;
    }
    else {
      bVar4 = true;
      uVar7 = 0;
      while (((((pfVar1 = (float *)((long)&local_78 + lVar6 + 4),
                *(float *)((long)afStack_b4 + lVar6) == *pfVar1 &&
                (!NAN(*(float *)((long)afStack_b4 + lVar6)) && !NAN(*pfVar1))) &&
               (fVar3 = *(float *)((long)afStack_b4 + lVar6 + 4),
               fVar3 == *(float *)((long)afStack_70 + lVar6))) &&
              ((!NAN(fVar3) && !NAN(*(float *)((long)afStack_70 + lVar6)) &&
               (pfVar1 = (float *)((long)afStack_70 + lVar6 + 4),
               *(float *)(&stack0xffffffffffffff54 + lVar6) == *pfVar1)))) &&
             (!NAN(*(float *)(&stack0xffffffffffffff54 + lVar6)) && !NAN(*pfVar1)))) {
        bVar4 = (uint)uVar7 < 3;
        if (uVar7 == 3) goto LAB_00920286;
        pfVar1 = (float *)(local_a8 + lVar6);
        uVar7 = uVar7 + 1;
        pfVar2 = (float *)((long)local_68.m_data + lVar6);
        lVar6 = lVar6 + 0x10;
        if ((*pfVar1 != *pfVar2) || (NAN(*pfVar1) || NAN(*pfVar2))) break;
      }
    }
    anon_unknown_0::Output("Invalid data at index %d.\n",uVar7 & 0xffffffff);
LAB_00920286:
    lVar6 = -(ulong)bVar4;
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std140, binding = 0) buffer Output {" NL
			   "  vec4 g_output[4];" NL "};" NL "uniform isamplerBuffer g_path_buffer;" NL
			   "uniform vec4[4] g_input0 = vec4[4](vec4(100), vec4(200), vec4(300), vec4(400));" NL
			   "uniform samplerBuffer g_input1;" NL "layout(binding = 1, std430) buffer Input2 {" NL
			   "  vec4[4] g_input2;" NL "};" NL NL "void Path2(int id) {" NL
			   "  g_output[id] = texelFetch(g_input1, int(gl_LocalInvocationIndex));" NL "}" NL "void main() {" NL
			   "  const int id = int(gl_GlobalInvocationID.x);" NL
			   "  const int path = texelFetch(g_path_buffer, id).x;" NL NL "  if (path == 0) {" NL
			   "    g_output[id] = g_input0[gl_LocalInvocationID.x];" NL "    memoryBarrier();" NL
			   "  } else if (path == 1) {" NL "    return;" NL "  } else if (path == 2) {" NL "    Path2(id);" NL
			   "    return;" NL "  } else if (path == 3) {" NL "    g_output[id] = g_input2[path - 1];" NL
			   "    memoryBarrierBuffer();" NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(4, m_buffer);
		glGenTextures(2, m_texture);

		/* init 'output' buffer */
		{
			std::vector<vec4> data(4, vec4(-100.0f));
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(sizeof(vec4) * data.size()), &data[0][0],
						 GL_DYNAMIC_COPY);
		}
		/* init 'input2' buffer */
		{
			const vec4 data[4] = { vec4(1.0f), vec4(2.0f), vec4(3.0f), vec4(4.0f) };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0][0], GL_DYNAMIC_COPY);
		}
		/* init 'path' buffer */
		{
			const int data[4] = { 3, 2, 1, 0 };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[2]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_R32I, m_buffer[2]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}
		/* init 'input1' buffer */
		{
			const vec4 data[4] = { vec4(10.0f), vec4(20.0f), vec4(30.0f), vec4(40.0f) };
			glBindBuffer(GL_TEXTURE_BUFFER, m_buffer[3]);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data[0], GL_STATIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
			glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
			glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer[3]);
			glBindTexture(GL_TEXTURE_BUFFER, 0);
		}

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_path_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_input1"), 1);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_BUFFER, m_texture[1]);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* validate 'output' buffer */
		{
			vec4 data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data[0][0]);

			const vec4 expected[4] = { vec4(3.0f), vec4(20.0f), vec4(-100.0f), vec4(400.0f) };
			for (int i = 0; i < 4; ++i)
			{
				if (!IsEqual(data[i], expected[i]))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}